

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void genlink(global_State *g,GCObject *o)

{
  byte bVar1;
  GCObject **pnext;
  
  bVar1 = o->marked;
  if ((bVar1 & 0x20) == 0) {
    __assert_fail("(((o)->marked) & ((1<<(5))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x204,"void genlink(global_State *, GCObject *)");
  }
  if ((bVar1 & 7) == 6) {
    o->marked = bVar1 & 0xfc;
  }
  else if ((bVar1 & 7) == 5) {
    if ((o->tt & 0xe) < 10) {
      pnext = getgclist(o);
      linkgclist_(o,pnext,&g->grayagain);
      return;
    }
    __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x206,"void genlink(global_State *, GCObject *)");
  }
  return;
}

Assistant:

static void genlink (global_State *g, GCObject *o) {
  lua_assert(isblack(o));
  if (getage(o) == G_TOUCHED1) {  /* touched in this cycle? */
    linkobjgclist(o, g->grayagain);  /* link it back in 'grayagain' */
  }  /* everything else do not need to be linked back */
  else if (getage(o) == G_TOUCHED2)
    changeage(o, G_TOUCHED2, G_OLD);  /* advance age */
}